

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_dec_vproc.cpp
# Opt level: O0

MPP_RET dec_vproc_set_dei_v1(MppDecVprocCtx *vproc_ctx,MppFrame frm)

{
  RK_U32 RVar1;
  RK_S64 RVar2;
  RK_S64 pts;
  long pts_00;
  bool local_93;
  bool local_92;
  bool local_91;
  RK_S64 first_pts;
  RK_S64 curr_pts;
  RK_S64 prev_pts;
  IepCap_t *cap;
  RK_U32 frame_err;
  int fd;
  MppBuffer dst1;
  MppBuffer dst0;
  MppBuffer buf;
  Mpp *pMStack_48;
  RK_U32 mode;
  Mpp *mpp;
  MppDecVprocCtxImpl *ctx;
  IepImg img;
  MPP_RET ret;
  MppFrame frm_local;
  MppDecVprocCtx *vproc_ctx_local;
  
  img.uv_addr = 0;
  pMStack_48 = (Mpp *)*vproc_ctx;
  mpp = (Mpp *)vproc_ctx;
  unique0x100005c5 = frm;
  buf._4_4_ = mpp_frame_get_mode(frm);
  dst0 = mpp_frame_get_buffer(stack0xffffffffffffffe8);
  dst1 = *(MppBuffer *)&mpp->mEncAyncIo;
  _frame_err = *(MppBuffer *)&mpp->mIoMode;
  cap._4_4_ = 0xffffffff;
  cap._0_4_ = 0;
  dec_vproc_set_img_fmt((IepImg *)&ctx,stack0xffffffffffffffe8);
  img.uv_addr = (**(code **)(*mpp->mUsrInPort + 0x10))(*(undefined8 *)&mpp->mExternalBufferMode,0,0)
  ;
  if (img.uv_addr != 0) {
    _mpp_log_l(4,"mpp_dec_vproc","IEP_CMD_INIT failed %d\n","dec_vproc_set_dei_v1",
               (ulong)img.uv_addr);
  }
  prev_pts = 0;
  img.uv_addr = (**(code **)(*mpp->mUsrInPort + 0x10))
                          (*(undefined8 *)&mpp->mExternalBufferMode,0x8000,&prev_pts);
  if (img.uv_addr != 0) {
    _mpp_log_l(4,"mpp_dec_vproc","IEP_CMD_QUERY_CAP failed %d\n","dec_vproc_set_dei_v1",
               (ulong)img.uv_addr);
  }
  if (((mpp->mEosTask == (MppTask)0x0) || (prev_pts == 0)) || (*(char *)(prev_pts + 1) == '\0')) {
    if ((vproc_debug & 2) != 0) {
      _mpp_log_l(4,"mpp_dec_vproc","2 field in and 1 frame out\n","dec_vproc_set_dei_v1");
    }
    dst0 = mpp_frame_get_buffer(stack0xffffffffffffffe8);
    cap._4_4_ = mpp_buffer_get_fd_with_caller(dst0,"dec_vproc_set_dei_v1");
    dec_vproc_set_img((MppDecVprocCtxImpl *)mpp,(IepImg *)&ctx,cap._4_4_,IEP_CMD_SET_SRC);
    RVar1 = mpp_frame_get_errinfo(stack0xffffffffffffffe8);
    local_93 = true;
    if (RVar1 == 0) {
      RVar1 = mpp_frame_get_discard(stack0xffffffffffffffe8);
      local_93 = RVar1 != 0;
    }
    cap._0_4_ = (uint)local_93;
    if ((dst1 == (MppBuffer)0x0) &&
       (_mpp_log_l(2,"mpp_dec_vproc","Assertion %s failed at %s:%d\n",(char *)0x0,"dst0",
                   "dec_vproc_set_dei_v1",0x158), (mpp_debug & 0x10000000) != 0)) {
      abort();
    }
    cap._4_4_ = mpp_buffer_get_fd_with_caller(dst1,"dec_vproc_set_dei_v1");
    dec_vproc_set_img((MppDecVprocCtxImpl *)mpp,(IepImg *)&ctx,cap._4_4_,IEP_CMD_SET_DST);
    *(undefined4 *)&mpp->mUsrOutPort = 1;
    buf._4_4_ = buf._4_4_ | 0x100;
    mpp_frame_set_mode(stack0xffffffffffffffe8,buf._4_4_);
    (*(code *)mpp->mVencInitKcfg)(mpp,buf._4_4_);
    dec_vproc_put_frame(pMStack_48,stack0xffffffffffffffe8,dst1,-1,(uint)cap);
    mpp->mEncAyncIo = 0;
    mpp->mEncAyncProc = 0;
  }
  else {
    if ((vproc_debug & 2) != 0) {
      _mpp_log_l(4,"mpp_dec_vproc","4 field in and 2 frame out\n","dec_vproc_set_dei_v1");
    }
    RVar2 = mpp_frame_get_pts(mpp->mEosTask);
    pts = mpp_frame_get_pts(stack0xffffffffffffffe8);
    pts_00 = (RVar2 + pts) / 2;
    dst0 = mpp_frame_get_buffer(mpp->mEosTask);
    cap._4_4_ = mpp_buffer_get_fd_with_caller(dst0,"dec_vproc_set_dei_v1");
    dec_vproc_set_img((MppDecVprocCtxImpl *)mpp,(IepImg *)&ctx,cap._4_4_,IEP_CMD_SET_SRC);
    RVar1 = mpp_frame_get_errinfo(mpp->mEosTask);
    local_91 = true;
    if (RVar1 == 0) {
      RVar1 = mpp_frame_get_discard(mpp->mEosTask);
      local_91 = RVar1 != 0;
    }
    cap._0_4_ = (uint)local_91;
    if ((dst1 == (MppBuffer)0x0) &&
       (_mpp_log_l(2,"mpp_dec_vproc","Assertion %s failed at %s:%d\n",(char *)0x0,"dst0",
                   "dec_vproc_set_dei_v1",0x12e), (mpp_debug & 0x10000000) != 0)) {
      abort();
    }
    cap._4_4_ = mpp_buffer_get_fd_with_caller(dst1,"dec_vproc_set_dei_v1");
    dec_vproc_set_img((MppDecVprocCtxImpl *)mpp,(IepImg *)&ctx,cap._4_4_,IEP_CMD_SET_DST);
    dst0 = mpp_frame_get_buffer(stack0xffffffffffffffe8);
    cap._4_4_ = mpp_buffer_get_fd_with_caller(dst0,"dec_vproc_set_dei_v1");
    dec_vproc_set_img((MppDecVprocCtxImpl *)mpp,(IepImg *)&ctx,cap._4_4_,IEP_CMD_SET_DEI_SRC1);
    RVar1 = mpp_frame_get_errinfo(stack0xffffffffffffffe8);
    local_92 = true;
    if (RVar1 == 0) {
      RVar1 = mpp_frame_get_discard(stack0xffffffffffffffe8);
      local_92 = RVar1 != 0;
    }
    cap._0_4_ = local_92 | (uint)cap;
    if ((_frame_err == (MppBuffer)0x0) &&
       (_mpp_log_l(2,"mpp_dec_vproc","Assertion %s failed at %s:%d\n",(char *)0x0,"dst1",
                   "dec_vproc_set_dei_v1",0x138), (mpp_debug & 0x10000000) != 0)) {
      abort();
    }
    cap._4_4_ = mpp_buffer_get_fd_with_caller(_frame_err,"dec_vproc_set_dei_v1");
    dec_vproc_set_img((MppDecVprocCtxImpl *)mpp,(IepImg *)&ctx,cap._4_4_,IEP_CMD_SET_DEI_DST1);
    *(undefined4 *)&mpp->mUsrOutPort = 3;
    buf._4_4_ = buf._4_4_ | 0x200;
    mpp_frame_set_mode(stack0xffffffffffffffe8,buf._4_4_);
    (*(code *)mpp->mVencInitKcfg)(mpp,buf._4_4_);
    if ((buf._4_4_ & 4) == 0) {
      dec_vproc_put_frame(pMStack_48,stack0xffffffffffffffe8,_frame_err,pts_00,(uint)cap);
      dec_vproc_put_frame(pMStack_48,stack0xffffffffffffffe8,dst1,pts,(uint)cap);
    }
    else {
      dec_vproc_put_frame(pMStack_48,stack0xffffffffffffffe8,dst1,pts_00,(uint)cap);
      dec_vproc_put_frame(pMStack_48,stack0xffffffffffffffe8,_frame_err,pts,(uint)cap);
    }
    mpp->mEncAyncIo = 0;
    mpp->mEncAyncProc = 0;
    mpp->mIoMode = MPP_IO_MODE_NORMAL;
    mpp->mDisableThread = 0;
  }
  return img.uv_addr;
}

Assistant:

static MPP_RET dec_vproc_set_dei_v1(MppDecVprocCtx *vproc_ctx, MppFrame frm)
{
    MPP_RET ret = MPP_OK;
    IepImg img;
    MppDecVprocCtxImpl *ctx = (MppDecVprocCtxImpl *)vproc_ctx;

    Mpp *mpp = ctx->mpp;
    RK_U32 mode = mpp_frame_get_mode(frm);
    MppBuffer buf = mpp_frame_get_buffer(frm);
    MppBuffer dst0 = ctx->out_buf0;
    MppBuffer dst1 = ctx->out_buf1;
    int fd = -1;
    RK_U32 frame_err = 0;

    // setup source IepImg
    dec_vproc_set_img_fmt(&img, frm);

    ret = ctx->com_ctx->ops->control(ctx->iep_ctx, IEP_CMD_INIT, NULL);
    if (ret)
        mpp_log_f("IEP_CMD_INIT failed %d\n", ret);

    IepCap_t *cap = NULL;
    ret = ctx->com_ctx->ops->control(ctx->iep_ctx, IEP_CMD_QUERY_CAP, &cap);
    if (ret)
        mpp_log_f("IEP_CMD_QUERY_CAP failed %d\n", ret);

    // setup destination IepImg with new buffer
    // NOTE: when deinterlace is enabled parser thread will reserve
    //       more buffer than normal case
    if (ctx->prev_frm0 && cap && cap->i4_deinterlace_supported) {
        // 4 in 2 out case
        vproc_dbg_status("4 field in and 2 frame out\n");
        RK_S64 prev_pts = mpp_frame_get_pts(ctx->prev_frm0);
        RK_S64 curr_pts = mpp_frame_get_pts(frm);
        RK_S64 first_pts = (prev_pts + curr_pts) / 2;

        buf = mpp_frame_get_buffer(ctx->prev_frm0);
        fd = mpp_buffer_get_fd(buf);
        dec_vproc_set_img(ctx, &img, fd, IEP_CMD_SET_SRC);
        frame_err = mpp_frame_get_errinfo(ctx->prev_frm0) ||
                    mpp_frame_get_discard(ctx->prev_frm0);
        // setup dst 0
        mpp_assert(dst0);
        fd = mpp_buffer_get_fd(dst0);
        dec_vproc_set_img(ctx, &img, fd, IEP_CMD_SET_DST);

        buf = mpp_frame_get_buffer(frm);
        fd = mpp_buffer_get_fd(buf);
        dec_vproc_set_img(ctx, &img, fd, IEP_CMD_SET_DEI_SRC1);
        frame_err |= mpp_frame_get_errinfo(frm) ||
                     mpp_frame_get_discard(frm);
        // setup dst 1
        mpp_assert(dst1);
        fd = mpp_buffer_get_fd(dst1);
        dec_vproc_set_img(ctx, &img, fd, IEP_CMD_SET_DEI_DST1);

        ctx->dei_cfg.dei_mode = IEP_DEI_MODE_I4O2;

        mode = mode | MPP_FRAME_FLAG_IEP_DEI_I4O2;
        mpp_frame_set_mode(frm, mode);

        // start hardware
        ctx->start_dei((MppDecVprocCtx *)ctx, mode);

        // NOTE: we need to process pts here
        if (mode & MPP_FRAME_FLAG_TOP_FIRST) {
            dec_vproc_put_frame(mpp, frm, dst0, first_pts, frame_err);
            dec_vproc_put_frame(mpp, frm, dst1, curr_pts, frame_err);
        } else {
            dec_vproc_put_frame(mpp, frm, dst1, first_pts, frame_err);
            dec_vproc_put_frame(mpp, frm, dst0, curr_pts, frame_err);
        }
        ctx->out_buf0 = NULL;
        ctx->out_buf1 = NULL;
    } else {
        // 2 in 1 out case
        vproc_dbg_status("2 field in and 1 frame out\n");
        buf = mpp_frame_get_buffer(frm);
        fd = mpp_buffer_get_fd(buf);
        dec_vproc_set_img(ctx, &img, fd, IEP_CMD_SET_SRC);
        frame_err = mpp_frame_get_errinfo(frm) ||
                    mpp_frame_get_discard(frm);

        // setup dst 0
        mpp_assert(dst0);
        fd = mpp_buffer_get_fd(dst0);
        dec_vproc_set_img(ctx, &img, fd, IEP_CMD_SET_DST);

        ctx->dei_cfg.dei_mode = IEP_DEI_MODE_I2O1;
        mode = mode | MPP_FRAME_FLAG_IEP_DEI_I2O1;
        mpp_frame_set_mode(frm, mode);

        // start hardware
        ctx->start_dei((MppDecVprocCtx *)ctx, mode);
        dec_vproc_put_frame(mpp, frm, dst0, -1, frame_err);
        ctx->out_buf0 = NULL;
    }

    return ret;
}